

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::emitCatchAll(BinaryInstWriter *this,Try *curr)

{
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if ((this->func != (Function *)0x0) && (this->sourceMap == false)) {
    WasmBinaryWriter::writeExtraDebugLocation
              (this->parent,(Expression *)curr,this->func,
               (curr->catchBodies).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements);
  }
  uStack_18 = CONCAT17(0x19,(undefined7)uStack_18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_18 + 7));
  return;
}

Assistant:

void BinaryInstWriter::emitCatchAll(Try* curr) {
  if (func && !sourceMap) {
    parent.writeExtraDebugLocation(curr, func, curr->catchBodies.size());
  }
  o << int8_t(BinaryConsts::CatchAll_Legacy);
}